

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linecontext.cpp
# Opt level: O0

int __thiscall LineContext::init(LineContext *this,EVP_PKEY_CTX *ctx)

{
  initializer_list<QString> args;
  initializer_list<QString> args_00;
  bool bVar1;
  QString *local_148;
  QString *local_130;
  undefined1 local_120 [8];
  QString ext;
  QString local_100;
  undefined1 local_e8 [16];
  undefined1 local_d8 [8];
  QStringList py;
  QString local_a8;
  QString local_90;
  QString local_78;
  QString local_60;
  undefined1 local_48 [16];
  undefined1 local_38 [8];
  QStringList cpp;
  QFileInfo info;
  QString *path_local;
  LineContext *this_local;
  
  if ((this->mInit & 1U) == 0) {
    this->mInit = true;
    QFileInfo::QFileInfo((QFileInfo *)&cpp.d.size,(QString *)ctx);
    QString::QString(&local_a8,"cpp");
    QString::QString(&local_90,"cxx");
    QString::QString(&local_78,"h");
    QString::QString(&local_60,"hpp");
    local_48._0_8_ = &local_a8;
    local_48._8_8_ = (char16_t *)0x4;
    args_00._M_len = 4;
    args_00._M_array = (iterator)local_48._0_8_;
    QList<QString>::QList((QList<QString> *)local_38,args_00);
    local_130 = (QString *)local_48;
    do {
      local_130 = local_130 + -1;
      QString::~QString(local_130);
    } while (local_130 != &local_a8);
    ext.d.size = (qsizetype)&local_100;
    QString::QString((QString *)ext.d.size,"py");
    local_e8._0_8_ = &local_100;
    local_e8._8_8_ = (char16_t *)0x1;
    args._M_len = 1;
    args._M_array = (iterator)local_e8._0_8_;
    QList<QString>::QList((QList<QString> *)local_d8,args);
    local_148 = (QString *)local_e8;
    do {
      local_148 = local_148 + -1;
      QString::~QString(local_148);
    } while (local_148 != &local_100);
    QFileInfo::suffix();
    bVar1 = QListSpecialMethods<QString>::contains
                      ((QListSpecialMethods<QString> *)local_38,(QString *)local_120,CaseSensitive);
    if (bVar1) {
      parseCpp(this,(QString *)ctx);
    }
    bVar1 = QListSpecialMethods<QString>::contains
                      ((QListSpecialMethods<QString> *)local_d8,(QString *)local_120,CaseSensitive);
    if (bVar1) {
      parsePython(this,(QString *)ctx);
    }
    QString::~QString((QString *)local_120);
    QList<QString>::~QList((QList<QString> *)local_d8);
    QList<QString>::~QList((QList<QString> *)local_38);
    this = (LineContext *)QFileInfo::~QFileInfo((QFileInfo *)&cpp.d.size);
  }
  return (int)this;
}

Assistant:

void LineContext::init(const QString &path)
{
    if (mInit) {
        return;
    }
    mInit = true;

    QFileInfo info(path);

    QStringList cpp = {"cpp", "cxx", "h", "hpp"};
    QStringList py = {"py"};

    QString ext = info.suffix();

    if (cpp.contains(ext)) {
        parseCpp(path);
    }
    if (py.contains(ext)) {
        parsePython(path);
    }
}